

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsInstPrinter.c
# Opt level: O1

void Mips_printInst(MCInst *MI,SStream *O,void *info)

{
  char *pcVar1;
  char cVar2;
  byte bVar3;
  _Bool _Var4;
  uint uVar5;
  uint uVar6;
  mips_reg Op;
  MCOperand *pMVar7;
  MCRegisterClass *pMVar8;
  int64_t iVar9;
  ulong uVar10;
  SStream *extraout_RDX;
  SStream *extraout_RDX_00;
  SStream *O_00;
  int opNum;
  SStream *in_R8;
  char *pcVar11;
  char *pcVar12;
  
  uVar5 = MCInst_getOpcode(MI);
  if (uVar5 - 0x547 < 2) {
    return;
  }
  if (uVar5 - 0x641 < 2) {
    return;
  }
  uVar5 = MCInst_getOpcode(MI);
  pcVar12 = (char *)0x0;
  if ((int)uVar5 < 0x21f) {
    if ((int)uVar5 < 0x11a) {
      pcVar12 = (char *)0x0;
      switch(uVar5) {
      case 0xa1:
        uVar5 = MCInst_getNumOperands(MI);
        if (uVar5 == 2) {
          pcVar12 = (char *)0x0;
          pMVar7 = MCInst_getOperand(MI,0);
          uVar5 = MCOperand_getReg(pMVar7);
          if (uVar5 == 0x1f) {
            pcVar12 = "bc0f $\x02";
LAB_0018f272:
            pcVar12 = cs_strdup(pcVar12);
            for (pcVar11 = pcVar12; cVar2 = *pcVar11, cVar2 != '\0'; pcVar11 = pcVar11 + 1) {
              if ((cVar2 == ' ') || (cVar2 == '\t')) {
                *pcVar11 = '\0';
                pcVar11 = pcVar11 + 1;
                break;
              }
            }
            SStream_concat0(O,pcVar12);
            if (*pcVar11 != '\0') {
              SStream_concat0(O,anon_var_dwarf_79498 + 0x11);
              do {
                cVar2 = *pcVar11;
                if (cVar2 == '$') {
                  pcVar1 = pcVar11 + 1;
                  if (*pcVar1 == -1) {
                    pcVar11 = pcVar11 + 3;
                  }
                  else {
                    pcVar11 = pcVar11 + 1;
                    printOperand(MI,(int)*pcVar1 - 1,O);
                  }
                }
                else {
                  if (cVar2 == '\0') break;
                  SStream_concat(O,"%c",(ulong)(uint)(int)cVar2);
                }
                pcVar11 = pcVar11 + 1;
              } while( true );
            }
          }
        }
        else {
LAB_0018f3fa:
          pcVar12 = (char *)0x0;
        }
        break;
      case 0xa2:
        uVar5 = MCInst_getNumOperands(MI);
        if (uVar5 != 2) goto LAB_0018f3fa;
        pcVar12 = (char *)0x0;
        pMVar7 = MCInst_getOperand(MI,0);
        uVar5 = MCOperand_getReg(pMVar7);
        if (uVar5 == 0x1f) {
          pcVar12 = "bc0fl $\x02";
          goto LAB_0018f272;
        }
        break;
      case 0xa3:
        uVar5 = MCInst_getNumOperands(MI);
        if (uVar5 != 2) goto LAB_0018f3fa;
        pcVar12 = (char *)0x0;
        pMVar7 = MCInst_getOperand(MI,0);
        uVar5 = MCOperand_getReg(pMVar7);
        if (uVar5 == 0x1f) {
          pcVar12 = "bc0t $\x02";
          goto LAB_0018f272;
        }
        break;
      case 0xa4:
        uVar5 = MCInst_getNumOperands(MI);
        if (uVar5 != 2) goto LAB_0018f3fa;
        pcVar12 = (char *)0x0;
        pMVar7 = MCInst_getOperand(MI,0);
        uVar5 = MCOperand_getReg(pMVar7);
        if (uVar5 == 0x1f) {
          pcVar12 = "bc0tl $\x02";
          goto LAB_0018f272;
        }
        break;
      case 0xa5:
      case 0xa8:
      case 0xa9:
      case 0xac:
      case 0xad:
      case 0xb0:
        break;
      case 0xa6:
        uVar5 = MCInst_getNumOperands(MI);
        if (uVar5 != 2) goto LAB_0018f3fa;
        pcVar12 = (char *)0x0;
        pMVar7 = MCInst_getOperand(MI,0);
        uVar5 = MCOperand_getReg(pMVar7);
        if (uVar5 == 0x9b) {
          pcVar12 = "bc1f $\x02";
          goto LAB_0018f272;
        }
        break;
      case 0xa7:
        uVar5 = MCInst_getNumOperands(MI);
        if (uVar5 != 2) goto LAB_0018f3fa;
        pcVar12 = (char *)0x0;
        pMVar7 = MCInst_getOperand(MI,0);
        uVar5 = MCOperand_getReg(pMVar7);
        if (uVar5 == 0x9b) {
          pcVar12 = "bc1fl $\x02";
          goto LAB_0018f272;
        }
        break;
      case 0xaa:
        uVar5 = MCInst_getNumOperands(MI);
        if (uVar5 != 2) goto LAB_0018f3fa;
        pcVar12 = (char *)0x0;
        pMVar7 = MCInst_getOperand(MI,0);
        uVar5 = MCOperand_getReg(pMVar7);
        if (uVar5 == 0x9b) {
          pcVar12 = "bc1t $\x02";
          goto LAB_0018f272;
        }
        break;
      case 0xab:
        uVar5 = MCInst_getNumOperands(MI);
        if (uVar5 != 2) goto LAB_0018f3fa;
        pcVar12 = (char *)0x0;
        pMVar7 = MCInst_getOperand(MI,0);
        uVar5 = MCOperand_getReg(pMVar7);
        if (uVar5 == 0x9b) {
          pcVar12 = "bc1tl $\x02";
          goto LAB_0018f272;
        }
        break;
      case 0xae:
        uVar5 = MCInst_getNumOperands(MI);
        if (uVar5 != 2) goto LAB_0018f3fa;
        pcVar12 = (char *)0x0;
        pMVar7 = MCInst_getOperand(MI,0);
        uVar5 = MCOperand_getReg(pMVar7);
        if (uVar5 == 0x1f) {
          pcVar12 = "bc2f $\x02";
          goto LAB_0018f272;
        }
        break;
      case 0xaf:
        uVar5 = MCInst_getNumOperands(MI);
        if (uVar5 != 2) goto LAB_0018f3fa;
        pcVar12 = (char *)0x0;
        pMVar7 = MCInst_getOperand(MI,0);
        uVar5 = MCOperand_getReg(pMVar7);
        if (uVar5 == 0x1f) {
          pcVar12 = "bc2fl $\x02";
          goto LAB_0018f272;
        }
        break;
      case 0xb1:
        uVar5 = MCInst_getNumOperands(MI);
        if (uVar5 != 2) goto LAB_0018f3fa;
        pcVar12 = (char *)0x0;
        pMVar7 = MCInst_getOperand(MI,0);
        uVar5 = MCOperand_getReg(pMVar7);
        if (uVar5 == 0x1f) {
          pcVar12 = "bc2t $\x02";
          goto LAB_0018f272;
        }
        break;
      case 0xb2:
        uVar5 = MCInst_getNumOperands(MI);
        if (uVar5 != 2) goto LAB_0018f3fa;
        pcVar12 = (char *)0x0;
        pMVar7 = MCInst_getOperand(MI,0);
        uVar5 = MCOperand_getReg(pMVar7);
        if (uVar5 == 0x1f) {
          pcVar12 = "bc2tl $\x02";
          goto LAB_0018f272;
        }
        break;
      case 0xb3:
        uVar5 = MCInst_getNumOperands(MI);
        if (uVar5 != 2) goto LAB_0018f3fa;
        pcVar12 = (char *)0x0;
        pMVar7 = MCInst_getOperand(MI,0);
        uVar5 = MCOperand_getReg(pMVar7);
        if (uVar5 == 0x1f) {
          pcVar12 = "bc3f $\x02";
          goto LAB_0018f272;
        }
        break;
      case 0xb4:
        uVar5 = MCInst_getNumOperands(MI);
        if (uVar5 != 2) goto LAB_0018f3fa;
        pcVar12 = (char *)0x0;
        pMVar7 = MCInst_getOperand(MI,0);
        uVar5 = MCOperand_getReg(pMVar7);
        if (uVar5 == 0x1f) {
          pcVar12 = "bc3fl $\x02";
          goto LAB_0018f272;
        }
        break;
      case 0xb5:
        uVar5 = MCInst_getNumOperands(MI);
        if (uVar5 != 2) goto LAB_0018f3fa;
        pcVar12 = (char *)0x0;
        pMVar7 = MCInst_getOperand(MI,0);
        uVar5 = MCOperand_getReg(pMVar7);
        if (uVar5 == 0x1f) {
          pcVar12 = "bc3t $\x02";
          goto LAB_0018f272;
        }
        break;
      case 0xb6:
        uVar5 = MCInst_getNumOperands(MI);
        if (uVar5 != 2) goto LAB_0018f3fa;
        pcVar12 = (char *)0x0;
        pMVar7 = MCInst_getOperand(MI,0);
        uVar5 = MCOperand_getReg(pMVar7);
        if (uVar5 == 0x1f) {
          pcVar12 = "bc3tl $\x02";
          goto LAB_0018f272;
        }
        break;
      default:
        if (uVar5 == 0x45) {
          uVar5 = MCInst_getNumOperands(MI);
          if (uVar5 != 3) goto LAB_0018f3fa;
          pcVar12 = (char *)0x0;
          pMVar7 = MCInst_getOperand(MI,0);
          _Var4 = MCOperand_isReg(pMVar7);
          if (_Var4) {
            pMVar8 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
            pcVar12 = (char *)0x0;
            pMVar7 = MCInst_getOperand(MI,0);
            uVar5 = MCOperand_getReg(pMVar7);
            _Var4 = MCRegisterClass_contains(pMVar8,uVar5);
            if (_Var4) {
              pMVar7 = MCInst_getOperand(MI,1);
              _Var4 = MCOperand_isReg(pMVar7);
              if (_Var4) {
                pMVar8 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
                pMVar7 = MCInst_getOperand(MI,1);
                uVar5 = MCOperand_getReg(pMVar7);
                _Var4 = MCRegisterClass_contains(pMVar8,uVar5);
                if (_Var4) {
                  pMVar7 = MCInst_getOperand(MI,2);
                  uVar5 = MCOperand_getReg(pMVar7);
                  if (uVar5 == 0x15) {
LAB_0018e800:
                    pcVar12 = "move $\x01, $\x02";
                    goto LAB_0018f272;
                  }
                }
              }
              goto LAB_0018f3fa;
            }
          }
        }
      }
    }
    else {
      if (uVar5 == 0x11a) {
        uVar5 = MCInst_getNumOperands(MI);
        if (uVar5 == 2) {
          pMVar7 = MCInst_getOperand(MI,0);
          _Var4 = MCOperand_isImm(pMVar7);
          if (_Var4) {
            pMVar7 = MCInst_getOperand(MI,0);
            iVar9 = MCOperand_getImm(pMVar7);
            if (iVar9 == 0) {
              pMVar7 = MCInst_getOperand(MI,1);
              _Var4 = MCOperand_isImm(pMVar7);
              if (_Var4) {
                pMVar7 = MCInst_getOperand(MI,1);
                iVar9 = MCOperand_getImm(pMVar7);
                if (iVar9 == 0) {
                  pcVar12 = "break";
                  goto LAB_0018f272;
                }
              }
            }
          }
        }
        uVar5 = MCInst_getNumOperands(MI);
        if (uVar5 == 2) {
          pMVar7 = MCInst_getOperand(MI,1);
          _Var4 = MCOperand_isImm(pMVar7);
          if (_Var4) {
            pMVar7 = MCInst_getOperand(MI,1);
            iVar9 = MCOperand_getImm(pMVar7);
            if (iVar9 == 0) {
              pcVar12 = "break $\x01";
              goto LAB_0018f272;
            }
          }
        }
        goto LAB_0018f3fa;
      }
      if (uVar5 == 0x20e) {
        uVar5 = MCInst_getNumOperands(MI);
        if (uVar5 != 3) goto LAB_0018f3fa;
        pcVar12 = (char *)0x0;
        pMVar7 = MCInst_getOperand(MI,0);
        _Var4 = MCOperand_isReg(pMVar7);
        if (_Var4) {
          pMVar8 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,0x1c);
          pcVar12 = (char *)0x0;
          pMVar7 = MCInst_getOperand(MI,0);
          uVar5 = MCOperand_getReg(pMVar7);
          _Var4 = MCRegisterClass_contains(pMVar8,uVar5);
          if (_Var4) {
            pMVar7 = MCInst_getOperand(MI,1);
            _Var4 = MCOperand_isReg(pMVar7);
            if (_Var4) {
              pMVar8 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,0x1c);
              pMVar7 = MCInst_getOperand(MI,1);
              uVar5 = MCOperand_getReg(pMVar7);
              _Var4 = MCRegisterClass_contains(pMVar8,uVar5);
              if (_Var4) {
                pMVar7 = MCInst_getOperand(MI,2);
                uVar5 = MCOperand_getReg(pMVar7);
                if (uVar5 == 0x14b) goto LAB_0018e800;
              }
            }
            goto LAB_0018f3fa;
          }
        }
      }
    }
  }
  else if ((int)uVar5 < 0x623) {
    if ((int)uVar5 < 0x36a) {
      if (0x363 < (int)uVar5) {
        if (uVar5 == 0x364) {
          uVar5 = MCInst_getNumOperands(MI);
          if (uVar5 == 2) {
            pcVar12 = (char *)0x0;
            pMVar7 = MCInst_getOperand(MI,0);
            uVar5 = MCOperand_getReg(pMVar7);
            if (uVar5 != 0x15) goto switchD_0018e050_caseD_a5;
            pMVar7 = MCInst_getOperand(MI,1);
            _Var4 = MCOperand_isReg(pMVar7);
            if (_Var4) {
              uVar5 = 8;
LAB_0018ece1:
              pMVar8 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,uVar5);
              pMVar7 = MCInst_getOperand(MI,1);
              uVar5 = MCOperand_getReg(pMVar7);
              _Var4 = MCRegisterClass_contains(pMVar8,uVar5);
              if (_Var4) {
                pcVar12 = "jr $\x02";
                goto LAB_0018f272;
              }
            }
          }
        }
        else {
          if (uVar5 != 0x366) goto switchD_0018e050_caseD_a5;
          uVar5 = MCInst_getNumOperands(MI);
          if (uVar5 == 2) {
            pcVar12 = (char *)0x0;
            pMVar7 = MCInst_getOperand(MI,0);
            uVar5 = MCOperand_getReg(pMVar7);
            if (uVar5 != 0x14b) goto switchD_0018e050_caseD_a5;
            pMVar7 = MCInst_getOperand(MI,1);
            _Var4 = MCOperand_isReg(pMVar7);
            if (_Var4) {
              uVar5 = 0x1c;
              goto LAB_0018ece1;
            }
          }
        }
        goto LAB_0018f3fa;
      }
      if (uVar5 == 0x21f) {
        uVar5 = MCInst_getNumOperands(MI);
        if (uVar5 != 1) goto LAB_0018f3fa;
        pcVar12 = (char *)0x0;
        pMVar7 = MCInst_getOperand(MI,0);
        uVar5 = MCOperand_getReg(pMVar7);
        if (uVar5 == 0x15) {
          pcVar12 = "di";
          goto LAB_0018f272;
        }
      }
      else if (uVar5 == 0x278) {
        uVar5 = MCInst_getNumOperands(MI);
        if (uVar5 != 1) goto LAB_0018f3fa;
        pcVar12 = (char *)0x0;
        pMVar7 = MCInst_getOperand(MI,0);
        uVar5 = MCOperand_getReg(pMVar7);
        if (uVar5 == 0x15) {
          pcVar12 = "ei";
          goto LAB_0018f272;
        }
      }
    }
    else {
      if ((int)uVar5 < 0x55d) {
        if (uVar5 == 0x36a) {
          uVar5 = MCInst_getNumOperands(MI);
          if (uVar5 == 2) {
            pcVar12 = (char *)0x0;
            pMVar7 = MCInst_getOperand(MI,0);
            uVar5 = MCOperand_getReg(pMVar7);
            if (uVar5 != 0x13) goto switchD_0018e050_caseD_a5;
            pMVar7 = MCInst_getOperand(MI,1);
            _Var4 = MCOperand_isReg(pMVar7);
            if (_Var4) {
              pMVar8 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
              pMVar7 = MCInst_getOperand(MI,1);
              uVar5 = MCOperand_getReg(pMVar7);
              _Var4 = MCRegisterClass_contains(pMVar8,uVar5);
              if (_Var4) {
                pcVar12 = "jalr.hb $\x02";
                goto LAB_0018f272;
              }
            }
          }
          goto LAB_0018f3fa;
        }
        if (uVar5 != 0x55c) goto switchD_0018e050_caseD_a5;
      }
      else if (uVar5 != 0x55d) {
        if (uVar5 == 0x5a2) {
          uVar5 = MCInst_getNumOperands(MI);
          if (uVar5 == 3) {
            pcVar12 = (char *)0x0;
            pMVar7 = MCInst_getOperand(MI,0);
            uVar5 = MCOperand_getReg(pMVar7);
            if (uVar5 != 0x15) goto switchD_0018e050_caseD_a5;
            pMVar7 = MCInst_getOperand(MI,1);
            uVar5 = MCOperand_getReg(pMVar7);
            if (uVar5 == 0x15) {
              pMVar7 = MCInst_getOperand(MI,2);
              _Var4 = MCOperand_isImm(pMVar7);
              if (_Var4) {
                pMVar7 = MCInst_getOperand(MI,2);
                iVar9 = MCOperand_getImm(pMVar7);
                if (iVar9 == 0) {
                  pcVar12 = "nop";
                  goto LAB_0018f272;
                }
              }
            }
          }
          goto LAB_0018f3fa;
        }
        if (uVar5 == 0x5fc) {
          uVar5 = MCInst_getNumOperands(MI);
          if (uVar5 != 3) goto LAB_0018f3fa;
          pcVar12 = (char *)0x0;
          pMVar7 = MCInst_getOperand(MI,0);
          _Var4 = MCOperand_isReg(pMVar7);
          if (_Var4) {
            pMVar8 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
            pcVar12 = (char *)0x0;
            pMVar7 = MCInst_getOperand(MI,0);
            uVar5 = MCOperand_getReg(pMVar7);
            _Var4 = MCRegisterClass_contains(pMVar8,uVar5);
            if (_Var4) {
              pMVar7 = MCInst_getOperand(MI,1);
              uVar5 = MCOperand_getReg(pMVar7);
              if (uVar5 == 0x15) {
                pMVar7 = MCInst_getOperand(MI,2);
                _Var4 = MCOperand_isReg(pMVar7);
                if (_Var4) {
                  pMVar8 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
                  pMVar7 = MCInst_getOperand(MI,2);
                  uVar5 = MCOperand_getReg(pMVar7);
                  _Var4 = MCRegisterClass_contains(pMVar8,uVar5);
                  if (_Var4) {
                    pcVar12 = "neg $\x01, $\x03";
                    goto LAB_0018f272;
                  }
                }
              }
              goto LAB_0018f3fa;
            }
          }
        }
        goto switchD_0018e050_caseD_a5;
      }
      uVar5 = MCInst_getNumOperands(MI);
      if (uVar5 != 1) goto LAB_0018f3fa;
      pcVar12 = (char *)0x0;
      pMVar7 = MCInst_getOperand(MI,0);
      _Var4 = MCOperand_isImm(pMVar7);
      if (_Var4) {
        pcVar12 = (char *)0x0;
        pMVar7 = MCInst_getOperand(MI,0);
        iVar9 = MCOperand_getImm(pMVar7);
        if (iVar9 == 0) {
          pcVar12 = "sdbbp";
          goto LAB_0018f272;
        }
      }
    }
  }
  else if ((int)uVar5 < 0x675) {
    if ((int)uVar5 < 0x63a) {
      if (uVar5 == 0x623) {
        uVar5 = MCInst_getNumOperands(MI);
        if (uVar5 != 3) goto LAB_0018f3fa;
        pcVar12 = (char *)0x0;
        pMVar7 = MCInst_getOperand(MI,0);
        _Var4 = MCOperand_isReg(pMVar7);
        if (_Var4) {
          pMVar8 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
          pcVar12 = (char *)0x0;
          pMVar7 = MCInst_getOperand(MI,0);
          uVar5 = MCOperand_getReg(pMVar7);
          _Var4 = MCRegisterClass_contains(pMVar8,uVar5);
          if (_Var4) {
            pMVar7 = MCInst_getOperand(MI,1);
            uVar5 = MCOperand_getReg(pMVar7);
            if (uVar5 == 0x15) {
              pMVar7 = MCInst_getOperand(MI,2);
              _Var4 = MCOperand_isReg(pMVar7);
              if (_Var4) {
                pMVar8 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
                pMVar7 = MCInst_getOperand(MI,2);
                uVar5 = MCOperand_getReg(pMVar7);
                _Var4 = MCRegisterClass_contains(pMVar8,uVar5);
                if (_Var4) {
                  pcVar12 = "negu $\x01, $\x03";
                  goto LAB_0018f272;
                }
              }
            }
            goto LAB_0018f3fa;
          }
        }
      }
      else if (uVar5 == 0x638) {
        uVar5 = MCInst_getNumOperands(MI);
        if (uVar5 != 1) goto LAB_0018f3fa;
        pcVar12 = (char *)0x0;
        pMVar7 = MCInst_getOperand(MI,0);
        _Var4 = MCOperand_isImm(pMVar7);
        if (_Var4) {
          pcVar12 = (char *)0x0;
          pMVar7 = MCInst_getOperand(MI,0);
          iVar9 = MCOperand_getImm(pMVar7);
          if (iVar9 == 0) {
            pcVar12 = "sync";
            goto LAB_0018f272;
          }
        }
      }
    }
    else if (uVar5 == 0x63a) {
      uVar5 = MCInst_getNumOperands(MI);
      if (uVar5 != 1) goto LAB_0018f3fa;
      pcVar12 = (char *)0x0;
      pMVar7 = MCInst_getOperand(MI,0);
      _Var4 = MCOperand_isImm(pMVar7);
      if (_Var4) {
        pcVar12 = (char *)0x0;
        pMVar7 = MCInst_getOperand(MI,0);
        iVar9 = MCOperand_getImm(pMVar7);
        if (iVar9 == 0) {
          pcVar12 = "syscall";
          goto LAB_0018f272;
        }
      }
    }
    else if (uVar5 == 0x66c) {
      uVar5 = MCInst_getNumOperands(MI);
      if (uVar5 != 3) goto LAB_0018f3fa;
      pcVar12 = (char *)0x0;
      pMVar7 = MCInst_getOperand(MI,0);
      _Var4 = MCOperand_isReg(pMVar7);
      if (_Var4) {
        pMVar8 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
        pcVar12 = (char *)0x0;
        pMVar7 = MCInst_getOperand(MI,0);
        uVar5 = MCOperand_getReg(pMVar7);
        _Var4 = MCRegisterClass_contains(pMVar8,uVar5);
        if (_Var4) {
          pMVar7 = MCInst_getOperand(MI,1);
          _Var4 = MCOperand_isReg(pMVar7);
          if (_Var4) {
            pMVar8 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
            pMVar7 = MCInst_getOperand(MI,1);
            uVar5 = MCOperand_getReg(pMVar7);
            _Var4 = MCRegisterClass_contains(pMVar8,uVar5);
            if (_Var4) {
              pMVar7 = MCInst_getOperand(MI,2);
              _Var4 = MCOperand_isImm(pMVar7);
              if (_Var4) {
                pMVar7 = MCInst_getOperand(MI,2);
                iVar9 = MCOperand_getImm(pMVar7);
                if (iVar9 == 0) {
                  pcVar12 = "teq $\x01, $\x02";
                  goto LAB_0018f272;
                }
              }
            }
          }
          goto LAB_0018f3fa;
        }
      }
    }
    else if (uVar5 == 0x670) {
      uVar5 = MCInst_getNumOperands(MI);
      if (uVar5 != 3) goto LAB_0018f3fa;
      pcVar12 = (char *)0x0;
      pMVar7 = MCInst_getOperand(MI,0);
      _Var4 = MCOperand_isReg(pMVar7);
      if (_Var4) {
        pMVar8 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
        pcVar12 = (char *)0x0;
        pMVar7 = MCInst_getOperand(MI,0);
        uVar5 = MCOperand_getReg(pMVar7);
        _Var4 = MCRegisterClass_contains(pMVar8,uVar5);
        if (_Var4) {
          pMVar7 = MCInst_getOperand(MI,1);
          _Var4 = MCOperand_isReg(pMVar7);
          if (_Var4) {
            pMVar8 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
            pMVar7 = MCInst_getOperand(MI,1);
            uVar5 = MCOperand_getReg(pMVar7);
            _Var4 = MCRegisterClass_contains(pMVar8,uVar5);
            if (_Var4) {
              pMVar7 = MCInst_getOperand(MI,2);
              _Var4 = MCOperand_isImm(pMVar7);
              if (_Var4) {
                pMVar7 = MCInst_getOperand(MI,2);
                iVar9 = MCOperand_getImm(pMVar7);
                if (iVar9 == 0) {
                  pcVar12 = "tge $\x01, $\x02";
                  goto LAB_0018f272;
                }
              }
            }
          }
          goto LAB_0018f3fa;
        }
      }
    }
  }
  else if ((int)uVar5 < 0x684) {
    if (uVar5 == 0x675) {
      uVar5 = MCInst_getNumOperands(MI);
      if (uVar5 != 3) goto LAB_0018f3fa;
      pcVar12 = (char *)0x0;
      pMVar7 = MCInst_getOperand(MI,0);
      _Var4 = MCOperand_isReg(pMVar7);
      if (_Var4) {
        pMVar8 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
        pcVar12 = (char *)0x0;
        pMVar7 = MCInst_getOperand(MI,0);
        uVar5 = MCOperand_getReg(pMVar7);
        _Var4 = MCRegisterClass_contains(pMVar8,uVar5);
        if (_Var4) {
          pMVar7 = MCInst_getOperand(MI,1);
          _Var4 = MCOperand_isReg(pMVar7);
          if (_Var4) {
            pMVar8 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
            pMVar7 = MCInst_getOperand(MI,1);
            uVar5 = MCOperand_getReg(pMVar7);
            _Var4 = MCRegisterClass_contains(pMVar8,uVar5);
            if (_Var4) {
              pMVar7 = MCInst_getOperand(MI,2);
              _Var4 = MCOperand_isImm(pMVar7);
              if (_Var4) {
                pMVar7 = MCInst_getOperand(MI,2);
                iVar9 = MCOperand_getImm(pMVar7);
                if (iVar9 == 0) {
                  pcVar12 = "tgeu $\x01, $\x02";
                  goto LAB_0018f272;
                }
              }
            }
          }
          goto LAB_0018f3fa;
        }
      }
    }
    else if (uVar5 == 0x680) {
      uVar5 = MCInst_getNumOperands(MI);
      if (uVar5 != 3) goto LAB_0018f3fa;
      pcVar12 = (char *)0x0;
      pMVar7 = MCInst_getOperand(MI,0);
      _Var4 = MCOperand_isReg(pMVar7);
      if (_Var4) {
        pMVar8 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
        pcVar12 = (char *)0x0;
        pMVar7 = MCInst_getOperand(MI,0);
        uVar5 = MCOperand_getReg(pMVar7);
        _Var4 = MCRegisterClass_contains(pMVar8,uVar5);
        if (_Var4) {
          pMVar7 = MCInst_getOperand(MI,1);
          _Var4 = MCOperand_isReg(pMVar7);
          if (_Var4) {
            pMVar8 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
            pMVar7 = MCInst_getOperand(MI,1);
            uVar5 = MCOperand_getReg(pMVar7);
            _Var4 = MCRegisterClass_contains(pMVar8,uVar5);
            if (_Var4) {
              pMVar7 = MCInst_getOperand(MI,2);
              _Var4 = MCOperand_isImm(pMVar7);
              if (_Var4) {
                pMVar7 = MCInst_getOperand(MI,2);
                iVar9 = MCOperand_getImm(pMVar7);
                if (iVar9 == 0) {
                  pcVar12 = "tlt $\x01, $\x02";
                  goto LAB_0018f272;
                }
              }
            }
          }
          goto LAB_0018f3fa;
        }
      }
    }
  }
  else if (uVar5 == 0x684) {
    uVar5 = MCInst_getNumOperands(MI);
    if (uVar5 != 3) goto LAB_0018f3fa;
    pcVar12 = (char *)0x0;
    pMVar7 = MCInst_getOperand(MI,0);
    _Var4 = MCOperand_isReg(pMVar7);
    if (_Var4) {
      pMVar8 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
      pcVar12 = (char *)0x0;
      pMVar7 = MCInst_getOperand(MI,0);
      uVar5 = MCOperand_getReg(pMVar7);
      _Var4 = MCRegisterClass_contains(pMVar8,uVar5);
      if (_Var4) {
        pMVar7 = MCInst_getOperand(MI,1);
        _Var4 = MCOperand_isReg(pMVar7);
        if (_Var4) {
          pMVar8 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
          pMVar7 = MCInst_getOperand(MI,1);
          uVar5 = MCOperand_getReg(pMVar7);
          _Var4 = MCRegisterClass_contains(pMVar8,uVar5);
          if (_Var4) {
            pMVar7 = MCInst_getOperand(MI,2);
            _Var4 = MCOperand_isImm(pMVar7);
            if (_Var4) {
              pMVar7 = MCInst_getOperand(MI,2);
              iVar9 = MCOperand_getImm(pMVar7);
              if (iVar9 == 0) {
                pcVar12 = "tltu $\x01, $\x02";
                goto LAB_0018f272;
              }
            }
          }
        }
        goto LAB_0018f3fa;
      }
    }
  }
  else if (uVar5 == 0x687) {
    uVar5 = MCInst_getNumOperands(MI);
    if (uVar5 != 3) goto LAB_0018f3fa;
    pcVar12 = (char *)0x0;
    pMVar7 = MCInst_getOperand(MI,0);
    _Var4 = MCOperand_isReg(pMVar7);
    if (_Var4) {
      pMVar8 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
      pcVar12 = (char *)0x0;
      pMVar7 = MCInst_getOperand(MI,0);
      uVar5 = MCOperand_getReg(pMVar7);
      _Var4 = MCRegisterClass_contains(pMVar8,uVar5);
      if (_Var4) {
        pMVar7 = MCInst_getOperand(MI,1);
        _Var4 = MCOperand_isReg(pMVar7);
        if (_Var4) {
          pMVar8 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
          pMVar7 = MCInst_getOperand(MI,1);
          uVar5 = MCOperand_getReg(pMVar7);
          _Var4 = MCRegisterClass_contains(pMVar8,uVar5);
          if (_Var4) {
            pMVar7 = MCInst_getOperand(MI,2);
            _Var4 = MCOperand_isImm(pMVar7);
            if (_Var4) {
              pMVar7 = MCInst_getOperand(MI,2);
              iVar9 = MCOperand_getImm(pMVar7);
              if (iVar9 == 0) {
                pcVar12 = "tne $\x01, $\x02";
                goto LAB_0018f272;
              }
            }
          }
        }
        goto LAB_0018f3fa;
      }
    }
  }
  else if (uVar5 == 0x69e) {
    uVar5 = MCInst_getNumOperands(MI);
    if (uVar5 != 1) goto LAB_0018f3fa;
    pcVar12 = (char *)0x0;
    pMVar7 = MCInst_getOperand(MI,0);
    _Var4 = MCOperand_isImm(pMVar7);
    if (_Var4) {
      pcVar12 = (char *)0x0;
      pMVar7 = MCInst_getOperand(MI,0);
      iVar9 = MCOperand_getImm(pMVar7);
      if (iVar9 == 0) {
        pcVar12 = "wait";
        goto LAB_0018f272;
      }
    }
  }
switchD_0018e050_caseD_a5:
  if (pcVar12 != (char *)0x0) goto switchD_0018f850_caseD_3;
  uVar5 = MCInst_getOpcode(MI);
  pcVar12 = (char *)0x0;
  if ((int)uVar5 < 0x102) {
    if ((int)uVar5 < 0xc0) {
      if (uVar5 == 0xa6) {
        pcVar12 = (char *)0x0;
        _Var4 = isReg(MI,0,0x9b);
        if (_Var4) {
          pcVar12 = "bc1f";
LAB_0018f6dc:
          uVar5 = 1;
LAB_0018f6e4:
          pcVar12 = printAlias1(pcVar12,MI,uVar5,O);
        }
      }
      else if (uVar5 == 0xaa) {
        pcVar12 = (char *)0x0;
        _Var4 = isReg(MI,0,0x9b);
        if (_Var4) {
          pcVar12 = "bc1t";
          goto LAB_0018f6dc;
        }
      }
      else if (uVar5 == 0xbf) {
        _Var4 = isReg(MI,0,0x15);
        if ((!_Var4) || (_Var4 = isReg(MI,1,0x15), !_Var4)) {
          uVar5 = 0x15;
          goto LAB_0018f6fb;
        }
        pcVar12 = "b";
        uVar5 = 2;
        goto LAB_0018f6e4;
      }
    }
    else if ((int)uVar5 < 0xcb) {
      if (uVar5 == 0xc0) {
        uVar5 = 0x14b;
LAB_0018f6fb:
        _Var4 = isReg(MI,1,uVar5);
        if (_Var4) {
          pcVar12 = "beqz";
          goto LAB_0018f70b;
        }
        goto LAB_0018f720;
      }
      if (uVar5 == 0xc2) {
        pcVar12 = (char *)0x0;
        _Var4 = isReg(MI,0,0x15);
        if (_Var4) {
          _Var4 = isReg(MI,1,0x15);
          if (_Var4) {
            pcVar12 = "beqzl";
            goto LAB_0018f70b;
          }
          goto LAB_0018f720;
        }
      }
    }
    else if (uVar5 == 0xcb) {
      pcVar12 = (char *)0x0;
      _Var4 = isReg(MI,0,0x15);
      if (_Var4) {
        pcVar12 = "bal";
        goto LAB_0018f6dc;
      }
    }
    else if (uVar5 == 0x101) {
      uVar5 = 0x15;
      goto LAB_0018f68a;
    }
  }
  else if ((int)uVar5 < 0x4d3) {
    if ((int)uVar5 < 0x364) {
      if (uVar5 == 0x102) {
        uVar5 = 0x14b;
LAB_0018f68a:
        _Var4 = isReg(MI,1,uVar5);
        if (!_Var4) goto LAB_0018f720;
        pcVar12 = "bnez";
LAB_0018f70b:
        uVar5 = 2;
        goto LAB_0018f713;
      }
      pcVar12 = (char *)0x0;
      if (uVar5 == 0x10c) {
        _Var4 = isReg(MI,1,0x15);
        if (_Var4) {
          pcVar12 = "bnezl";
          goto LAB_0018f70b;
        }
        goto LAB_0018f720;
      }
    }
    else {
      if (uVar5 == 0x364) {
        uVar5 = 0x13;
      }
      else {
        if (uVar5 != 0x366) goto LAB_0018f723;
        uVar5 = 0x115;
      }
      pcVar12 = (char *)0x0;
      _Var4 = isReg(MI,0,uVar5);
      if (_Var4) {
        pcVar12 = "jalr";
        goto LAB_0018f6dc;
      }
    }
  }
  else {
    if ((int)uVar5 < 0x4d6) {
      if (uVar5 == 0x4d3) {
LAB_0018f5f4:
        uVar5 = 0x15;
      }
      else {
        if (uVar5 != 0x4d4) goto LAB_0018f723;
        uVar5 = 0x14b;
      }
      _Var4 = isReg(MI,2,uVar5);
      if (!_Var4) {
LAB_0018f720:
        pcVar12 = (char *)0x0;
        goto LAB_0018f723;
      }
      pcVar12 = "not";
    }
    else {
      if (uVar5 == 0x4d6) goto LAB_0018f5f4;
      if (uVar5 != 0x4dd) goto LAB_0018f723;
      _Var4 = isReg(MI,2,0x15);
      if (!_Var4) goto LAB_0018f720;
      pcVar12 = "move";
    }
    uVar5 = 1;
LAB_0018f713:
    pcVar12 = printAlias2(pcVar12,MI,uVar5,(uint)O,in_R8);
  }
LAB_0018f723:
  if (pcVar12 != (char *)0x0) goto switchD_0018f850_caseD_3;
  uVar5 = MCInst_getOpcode(MI);
  uVar5 = *(uint *)(printInstruction_OpInfo + (ulong)uVar5 * 4);
  uVar6 = MCInst_getOpcode(MI);
  bVar3 = printInstruction_OpInfo2[uVar6];
  SStream_concat0(O,s_DSPCarry_00302bd7 + (ulong)(uVar5 & 0x3fff) + 8);
  switch(uVar5 >> 0xe & 7) {
  default:
    goto switchD_0018f78c_caseD_0;
  case 1:
    break;
  case 2:
    printUnsignedImm(MI,2,O);
    SStream_concat0(O,", ");
    pcVar12 = (char *)0x0;
    printMemOperand(MI,0,O);
    goto switchD_0018f850_caseD_3;
  case 3:
    printOperand(MI,1,O);
    SStream_concat0(O,", ");
    pcVar12 = (char *)0x0;
    switch(uVar5 >> 0x11 & 0xf) {
    default:
      goto switchD_0018f850_caseD_0;
    case 1:
      goto switchD_0018f850_caseD_1;
    case 2:
      goto switchD_0018f850_caseD_2;
    case 3:
      goto switchD_0018f850_caseD_3;
    case 4:
      goto switchD_0018f850_caseD_4;
    case 5:
      goto switchD_0018f850_caseD_5;
    case 6:
      goto switchD_0018f850_caseD_6;
    case 7:
      goto switchD_0018f850_caseD_7;
    case 8:
      goto switchD_0018f850_caseD_8;
    case 9:
      goto switchD_0018f850_caseD_9;
    case 10:
      goto switchD_0018f850_caseD_a;
    case 0xb:
      goto switchD_0018f850_caseD_b;
    case 0xc:
      goto switchD_0018f850_caseD_c;
    case 0xd:
      goto switchD_0018f850_caseD_d;
    case 0xe:
      goto switchD_0018f850_caseD_e;
    }
  case 4:
    pMVar7 = MCInst_getOperand(MI,2);
    uVar10 = MCOperand_getImm(pMVar7);
    if ((uVar10 & 0xffffffe0) == 0) {
      pcVar12 = &DAT_001eb720 + *(int *)(&DAT_001eb720 + (ulong)((uint)uVar10 & 0x1f) * 4);
    }
    else {
      pcVar12 = (char *)0x0;
    }
    SStream_concat0(O,pcVar12);
    pcVar12 = (char *)0x0;
    switch(uVar5 >> 0x11 & 0xf) {
    default:
      goto switchD_0018f850_caseD_0;
    case 1:
      goto switchD_0018f850_caseD_1;
    case 2:
      goto switchD_0018f850_caseD_2;
    case 3:
      goto switchD_0018f850_caseD_3;
    case 4:
      goto switchD_0018f850_caseD_4;
    case 5:
      goto switchD_0018f850_caseD_5;
    case 6:
      goto switchD_0018f850_caseD_6;
    case 7:
      goto switchD_0018f850_caseD_7;
    case 8:
      goto switchD_0018f850_caseD_8;
    case 9:
      goto switchD_0018f850_caseD_9;
    case 10:
      goto switchD_0018f850_caseD_a;
    case 0xb:
      goto switchD_0018f850_caseD_b;
    case 0xc:
      goto switchD_0018f850_caseD_c;
    case 0xd:
      goto switchD_0018f850_caseD_d;
    case 0xe:
      goto switchD_0018f850_caseD_e;
    }
  case 5:
    printOperand(MI,2,O);
    pcVar12 = ", ";
    goto LAB_0018f889;
  case 6:
    printOperand(MI,3,O);
    pcVar12 = (char *)0x0;
    switch(uVar5 >> 0x11 & 0xf) {
    default:
      goto switchD_0018f850_caseD_0;
    case 1:
      goto switchD_0018f850_caseD_1;
    case 2:
      goto switchD_0018f850_caseD_2;
    case 3:
      goto switchD_0018f850_caseD_3;
    case 4:
      goto switchD_0018f850_caseD_4;
    case 5:
      goto switchD_0018f850_caseD_5;
    case 6:
      goto switchD_0018f850_caseD_6;
    case 7:
      goto switchD_0018f850_caseD_7;
    case 8:
      goto switchD_0018f850_caseD_8;
    case 9:
      goto switchD_0018f850_caseD_9;
    case 10:
      goto switchD_0018f850_caseD_a;
    case 0xb:
      goto switchD_0018f850_caseD_b;
    case 0xc:
      goto switchD_0018f850_caseD_c;
    case 0xd:
      goto switchD_0018f850_caseD_d;
    case 0xe:
      goto switchD_0018f850_caseD_e;
    }
  }
  printOperand(MI,0,O);
  pcVar12 = (char *)0x0;
  switch(uVar5 >> 0x11 & 0xf) {
  default:
switchD_0018f850_caseD_0:
    pcVar12 = ", ";
    goto LAB_0018f9a7;
  case 1:
switchD_0018f850_caseD_1:
    SStream_concat0(O,", $pc, ");
    uVar5 = 1;
    goto LAB_0018fae6;
  case 2:
switchD_0018f850_caseD_2:
    pcVar12 = " # 16 bit inst";
    break;
  case 3:
    goto switchD_0018f850_caseD_3;
  case 4:
    goto switchD_0018f850_caseD_4;
  case 5:
    goto switchD_0018f850_caseD_5;
  case 6:
switchD_0018f850_caseD_6:
    printOperand(MI,2,O);
    O_00 = extraout_RDX;
    goto LAB_0018f9af;
  case 7:
switchD_0018f850_caseD_7:
    pcVar12 = ".d\t";
    goto LAB_0018f9e6;
  case 8:
switchD_0018f850_caseD_8:
    pcVar12 = ".s\t";
LAB_0018f9e6:
    SStream_concat0(O,pcVar12);
    printOperand(MI,0,O);
    SStream_concat0(O,", ");
    uVar5 = 1;
    goto LAB_0018fa15;
  case 9:
switchD_0018f850_caseD_9:
    pcVar12 = "[";
LAB_0018f9a7:
    SStream_concat0(O,pcVar12);
    O_00 = extraout_RDX_00;
LAB_0018f9af:
    switch(uVar5 >> 0x15 & 0xf) {
    case 1:
      uVar6 = 2;
      goto LAB_0018fb2c;
    case 2:
      printMemOperandEA(MI,(uint)O,O_00);
      break;
    case 3:
      break;
    case 4:
      printUnsignedImm(MI,3,O);
      pcVar12 = "], ";
      goto LAB_0018fad6;
    case 5:
      printUnsignedImm(MI,2,O);
      SStream_concat0(O,"], ");
      printOperand(MI,3,O);
      SStream_concat0(O,"[");
      printUnsignedImm(MI,4,O);
      goto switchD_0018fdae_caseD_2;
    case 6:
      opNum = 1;
LAB_0018fb04:
      printMemOperand(MI,opNum,O);
      break;
    case 7:
      uVar5 = 1;
      goto LAB_0018fb16;
    case 8:
      pcVar12 = "\n\tmflo\t";
LAB_0018f889:
      SStream_concat0(O,pcVar12);
switchD_0018f850_caseD_5:
      uVar5 = 0;
LAB_0018fa15:
      pcVar12 = (char *)0x0;
      printOperand(MI,uVar5,O);
      goto switchD_0018f850_caseD_3;
    case 9:
      uVar6 = 4;
      goto LAB_0018fb2c;
    case 10:
      SStream_concat0(O,"\n\tmove\t");
      pcVar12 = (char *)0x0;
      printOperand(MI,0,O);
      SStream_concat0(O,", $t8");
      goto switchD_0018f850_caseD_3;
    default:
      uVar6 = 1;
LAB_0018fb2c:
      printOperand(MI,uVar6,O);
      switch(uVar5 >> 0x19 & 0xf) {
      default:
        goto switchD_0018f78c_caseD_0;
      case 1:
        pcVar12 = ", ";
        goto LAB_0018fc34;
      case 2:
        pcVar12 = "\t# 16 bit inst";
        break;
      case 3:
        goto switchD_0018f850_caseD_4;
      case 4:
        pcVar12 = "\n\tbteqz\t";
        goto LAB_0018fad6;
      case 5:
        pcVar12 = "\n\tbtnez\t";
        goto LAB_0018fad6;
      case 6:
        pcVar12 = "[";
LAB_0018fc34:
        SStream_concat0(O,pcVar12);
        switch(uVar5 >> 0x1d) {
        case 1:
          goto switchD_0018fc5b_caseD_1;
        case 2:
          printUnsignedImm(MI,2,O);
          pcVar12 = (char *)0x0;
          switch(bVar3 & 3) {
          default:
            goto switchD_0018f850_caseD_3;
          case 1:
            goto switchD_0018fdae_caseD_1;
          case 2:
            goto switchD_0018fdae_caseD_2;
          }
        case 3:
          printUnsignedImm8(MI,3,O);
          pcVar12 = (char *)0x0;
          switch(bVar3 & 3) {
          default:
            goto switchD_0018f850_caseD_3;
          case 1:
            goto switchD_0018fdae_caseD_1;
          case 2:
            goto switchD_0018fdae_caseD_2;
          }
        case 4:
          printOperand(MI,3,O);
          pcVar12 = (char *)0x0;
          switch(bVar3 & 3) {
          default:
            goto switchD_0018f850_caseD_3;
          case 1:
            goto switchD_0018fdae_caseD_1;
          case 2:
            goto switchD_0018fdae_caseD_2;
          }
        default:
          printOperand(MI,2,O);
          pcVar12 = (char *)0x0;
          switch(bVar3 & 3) {
          default:
            goto switchD_0018f850_caseD_3;
          case 1:
            goto switchD_0018fdae_caseD_1;
          case 2:
            goto switchD_0018fdae_caseD_2;
          }
        }
      case 7:
        pcVar12 = " \t# 16 bit inst";
        break;
      case 8:
        pcVar12 = ", 32";
        break;
      case 9:
        SStream_concat0(O,"\n\taddiu\t");
        printOperand(MI,1,O);
        SStream_concat0(O,", $pc, ");
        printOperand(MI,3,O);
        pcVar12 = "\n ";
        break;
      case 10:
        SStream_concat0(O,"(");
        printOperand(MI,1,O);
        pcVar12 = ")";
        break;
      case 0xb:
        SStream_concat0(O," ( ");
        printOperand(MI,1,O);
        pcVar12 = " ); ";
        break;
      case 0xc:
        pcVar12 = ", 0";
        break;
      case 0xd:
        pcVar12 = "\n\tbteqz\t.+4\n\tmove ";
        goto LAB_0018f917;
      case 0xe:
        pcVar12 = "\n\tbtnez\t.+4\n\tmove ";
LAB_0018f917:
        SStream_concat0(O,pcVar12);
        printOperand(MI,1,O);
        pcVar12 = ", ";
LAB_0018fad6:
        SStream_concat0(O,pcVar12);
        uVar5 = 2;
LAB_0018fae6:
        printOperand(MI,uVar5,O);
        goto switchD_0018f78c_caseD_0;
      }
      goto LAB_0018fb63;
    }
    goto switchD_0018f78c_caseD_0;
  case 10:
switchD_0018f850_caseD_a:
    pcVar12 = "\n\tnop";
    break;
  case 0xb:
switchD_0018f850_caseD_b:
    pcVar12 = "\t# branch\n\tnop";
    break;
  case 0xc:
switchD_0018f850_caseD_c:
    SStream_concat0(O,", 1f\n\tb\t2f\n\t.align\t2\n1: \t.word\t");
    printOperand(MI,1,O);
    pcVar12 = "\n2:";
    break;
  case 0xd:
switchD_0018f850_caseD_d:
    opNum = 2;
    goto LAB_0018fb04;
  case 0xe:
switchD_0018f850_caseD_e:
    pcVar12 = ", .+4\n\t\n\tmove ";
    goto LAB_0018f917;
  }
  goto LAB_0018fb63;
switchD_0018fc5b_caseD_1:
  printUnsignedImm8(MI,2,O);
  pcVar12 = (char *)0x0;
  switch(bVar3 & 3) {
  default:
    goto switchD_0018f850_caseD_3;
  case 1:
    break;
  case 2:
switchD_0018fdae_caseD_2:
    pcVar12 = "]";
    goto LAB_0018fb63;
  }
switchD_0018fdae_caseD_1:
  SStream_concat0(O,", ");
  uVar5 = 3;
  if ((bVar3 & 4) == 0) {
LAB_0018fb16:
    printUnsignedImm(MI,uVar5,O);
    goto switchD_0018f78c_caseD_0;
  }
  goto LAB_0018fae6;
switchD_0018f850_caseD_4:
  pcVar12 = "  # 16 bit inst";
LAB_0018fb63:
  SStream_concat0(O,pcVar12);
switchD_0018f78c_caseD_0:
  pcVar12 = (char *)0x0;
switchD_0018f850_caseD_3:
  if (pcVar12 == (char *)0x0) {
    return;
  }
  Op = Mips_map_insn(pcVar12);
  MCInst_setOpcodePub(MI,Op);
  (*cs_mem_free)(pcVar12);
  return;
}

Assistant:

void Mips_printInst(MCInst *MI, SStream *O, void *info)
{
	char *mnem;

	switch (MCInst_getOpcode(MI)) {
		default: break;
		case Mips_Save16:
		case Mips_SaveX16:
		case Mips_Restore16:
		case Mips_RestoreX16:
			return;
	}

	// Try to print any aliases first.
	mnem = printAliasInstr(MI, O, info);
	if (!mnem) {
		mnem = printAlias(MI, O);
		if (!mnem) {
			printInstruction(MI, O, NULL);
		}
	}

	if (mnem) {
		// fixup instruction id due to the change in alias instruction
		MCInst_setOpcodePub(MI, Mips_map_insn(mnem));
		cs_mem_free(mnem);
	}
}